

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O2

float plutovg_font_face_text_extents
                (plutovg_font_face_t *face,float size,void *text,int length,
                plutovg_text_encoding_t encoding,plutovg_rect_t *extents)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  plutovg_codepoint_t codepoint;
  plutovg_rect_t *ppVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float advance_width;
  plutovg_rect_t glyph_extents;
  plutovg_text_iterator_t it;
  float local_5c;
  plutovg_rect_t local_58;
  plutovg_text_iterator_t local_48;
  
  plutovg_text_iterator_init(&local_48,text,length,encoding);
  fVar5 = 0.0;
  ppVar4 = (plutovg_rect_t *)0x0;
  while (local_48.index < local_48.length) {
    codepoint = plutovg_text_iterator_next(&local_48);
    if (extents == (plutovg_rect_t *)0x0) {
      plutovg_font_face_get_glyph_metrics
                (face,size,codepoint,&local_5c,(float *)0x0,(plutovg_rect_t *)0x0);
    }
    else {
      plutovg_font_face_get_glyph_metrics(face,size,codepoint,&local_5c,(float *)0x0,&local_58);
      local_58.x = local_58.x + fVar5;
      if (ppVar4 == (plutovg_rect_t *)0x0) {
        extents->x = local_58.x;
        extents->y = local_58.y;
        extents->w = local_58.w;
        extents->h = local_58.h;
        ppVar4 = extents;
      }
      else {
        uVar2._0_4_ = ppVar4->x;
        uVar2._4_4_ = ppVar4->y;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = uVar2;
        uVar1 = ppVar4->w;
        uVar3 = ppVar4->h;
        auVar8._0_4_ = (float)uVar1 + (float)(undefined4)uVar2;
        auVar8._4_4_ = (float)uVar3 + (float)uVar2._4_4_;
        auVar8._8_8_ = 0;
        auVar7._4_4_ = local_58.y;
        auVar7._0_4_ = local_58.x;
        auVar7._8_8_ = 0;
        auVar7 = minps(auVar6,auVar7);
        auVar9._4_4_ = local_58.h + local_58.y;
        auVar9._0_4_ = local_58.w + local_58.x;
        auVar9._8_8_ = 0;
        auVar9 = maxps(auVar8,auVar9);
        ppVar4->x = (float)(int)auVar7._0_8_;
        ppVar4->y = (float)(int)(auVar7._0_8_ >> 0x20);
        ppVar4->w = auVar9._0_4_ - auVar7._0_4_;
        ppVar4->h = auVar9._4_4_ - auVar7._4_4_;
      }
    }
    fVar5 = fVar5 + local_5c;
  }
  if (ppVar4 == (plutovg_rect_t *)0x0 && extents != (plutovg_rect_t *)0x0) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return fVar5;
}

Assistant:

float plutovg_font_face_text_extents(plutovg_font_face_t* face, float size, const void* text, int length, plutovg_text_encoding_t encoding, plutovg_rect_t* extents)
{
    plutovg_text_iterator_t it;
    plutovg_text_iterator_init(&it, text, length, encoding);
    plutovg_rect_t* text_extents = NULL;
    float total_advance_width = 0.f;
    while(plutovg_text_iterator_has_next(&it)) {
        plutovg_codepoint_t codepoint = plutovg_text_iterator_next(&it);

        float advance_width;
        if(extents == NULL) {
            plutovg_font_face_get_glyph_metrics(face, size, codepoint, &advance_width, NULL, NULL);
            total_advance_width += advance_width;
            continue;
        }

        plutovg_rect_t glyph_extents;
        plutovg_font_face_get_glyph_metrics(face, size, codepoint, &advance_width, NULL, &glyph_extents);

        glyph_extents.x += total_advance_width;
        total_advance_width += advance_width;
        if(text_extents == NULL) {
            text_extents = extents;
            *text_extents = glyph_extents;
            continue;
        }

        float x1 = plutovg_min(text_extents->x, glyph_extents.x);
        float y1 = plutovg_min(text_extents->y, glyph_extents.y);
        float x2 = plutovg_max(text_extents->x + text_extents->w, glyph_extents.x + glyph_extents.w);
        float y2 = plutovg_max(text_extents->y + text_extents->h, glyph_extents.y + glyph_extents.h);

        text_extents->x = x1;
        text_extents->y = y1;
        text_extents->w = x2 - x1;
        text_extents->h = y2 - y1;
    }

    if(extents && !text_extents) {
        extents->x = 0;
        extents->y = 0;
        extents->w = 0;
        extents->h = 0;
    }

    return total_advance_width;
}